

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::PromGetStatus(FpgaIO *this,uint32_t *status,PromType type)

{
  BasePort *pBVar1;
  uint uVar2;
  nodeaddr_t nVar3;
  bool local_29;
  bool ret;
  nodeaddr_t address;
  quadlet_t data;
  PromType type_local;
  uint32_t *status_local;
  FpgaIO *this_local;
  
  nVar3 = GetPromAddress(this,type,true);
  pBVar1 = (this->super_BoardIO).port;
  uVar2 = (*pBVar1->_vptr_BasePort[0x24])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar3,0x5000000);
  local_29 = (bool)((byte)uVar2 & 1);
  if ((uVar2 & 1) != 0) {
    (*((this->super_BoardIO).port)->_vptr_BasePort[0x2c])();
    local_29 = PromGetResult(this,status,type);
  }
  return local_29;
}

Assistant:

bool FpgaIO::PromGetStatus(uint32_t &status, PromType type)
{
    quadlet_t data = 0x05000000;
    nodeaddr_t address = GetPromAddress(type, true);

    bool ret = port->WriteQuadlet(BoardId, address, data);
    if (ret) {
        port->PromDelay();
        // Should be ready by now...
        ret = PromGetResult(status, type);
    }
    return ret;
}